

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fp8.cpp
# Opt level: O0

void HandleFp32ToFp8ExponentMantissa<MILBlob::Fp8E5M2,MILBlob::Fp8E5M2::Cast>
               (Cast *fp8,FloatCast *fp32)

{
  range_error *this;
  FloatCast fp32_bias;
  int32_t unbiasedExponent;
  FloatCast *fp32_local;
  Cast *fp8_local;
  
  if ((int)((fp32->bytes >> 0x17 & 0xff) - 0x70) < 1) {
    fp32->f = (float)(fp32->bytes & 0x80000000 | 0x38800000) + fp32->f;
    fp8->byte = fp8->byte & 0x83;
  }
  else {
    fp8->byte = fp8->byte & 0x83 | ((char)(fp32->bytes >> 0x17) + 0x90U & 0x1f) << 2;
  }
  if ((fp32->bytes & 0x1fffff) != 0) {
    this = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this,"FP8 SetFloat requires rounding for the given value.");
    __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  fp8->byte = fp8->byte & 0xfc | (byte)((int)(fp32->bytes & 0x7fffff) >> 0x15);
  return;
}

Assistant:

void HandleFp32ToFp8ExponentMantissa(FP8_CAST& fp8, FloatCast& fp32)
{
    int32_t unbiasedExponent = fp32.components.exponent - fp32ExponentBias;
    if (unbiasedExponent + FP8_TYPE::fp8ExponentBias > 0) {
        // Normal.
        fp8.components.exponent = uint8_t(fp32.components.exponent - fp32ExponentBias + FP8_TYPE::fp8ExponentBias);
    } else {
        // Denormal.
        FloatCast fp32_bias;
        fp32_bias.components.sign = fp32.components.sign;
        fp32_bias.components.exponent = -1 * FP8_TYPE::fp8ExponentBias + fp32ExponentBias + 1;
        fp32_bias.components.mantissa = 0;
        fp32.f += fp32_bias.f;
        fp8.components.exponent = 0;
    }
    if ((fp32.components.mantissa & ((0x1 << (fp32MantissaBits - FP8_TYPE::fp8MantissaBits)) - 1)) != 0) {
        throw std::range_error("FP8 SetFloat requires rounding for the given value.");
    }
    fp8.components.mantissa = fp32.components.mantissa >> (fp32MantissaBits - FP8_TYPE::fp8MantissaBits);
}